

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool __thiscall
cmStringCommand::RegexReplace
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  int n_00;
  cmMakefile *this_00;
  pointer name;
  bool bVar1;
  const_reference __rhs;
  const_reference __rhs_00;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *r_00;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  reference pvVar8;
  size_type sVar9;
  string local_4c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  undefined1 local_440 [8];
  string e_3;
  size_type len;
  size_type end;
  size_type start;
  int n;
  uint i;
  undefined1 local_3c0 [8];
  string e_2;
  size_type r_1;
  size_type l2;
  size_type base;
  string output;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_328;
  undefined1 local_318 [8];
  string input;
  undefined1 local_2d8 [8];
  string e_1;
  RegularExpression re;
  allocator local_1c1;
  undefined1 local_1c0 [8];
  string e;
  RegexReplacement local_178;
  RegexReplacement local_150;
  undefined4 local_128;
  allocator local_121;
  string local_120;
  string local_100;
  RegexReplacement local_e0;
  string local_a8;
  RegexReplacement local_88;
  size_type local_60;
  size_type r;
  size_type l;
  vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  replacement;
  string *outvar;
  string *replace;
  string *regex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmStringCommand *this_local;
  
  __rhs = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](args,2);
  __rhs_00 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,3);
  replacement.
  super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](args,4);
  std::vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ::vector((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
            *)&l);
  r = 0;
  while (sVar5 = r, uVar2 = std::__cxx11::string::length(), sVar5 < uVar2) {
    local_60 = std::__cxx11::string::find((char)__rhs_00,0x5c);
    if (local_60 == 0xffffffffffffffff) {
      local_60 = std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)&local_a8,(ulong)__rhs_00);
      RegexReplacement::RegexReplacement(&local_88,&local_a8);
      std::
      vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
      ::push_back((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                   *)&l,&local_88);
      RegexReplacement::~RegexReplacement(&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    else {
      if (local_60 != r) {
        std::__cxx11::string::substr((ulong)&local_100,(ulong)__rhs_00);
        RegexReplacement::RegexReplacement(&local_e0,&local_100);
        std::
        vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
        ::push_back((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                     *)&l,&local_e0);
        RegexReplacement::~RegexReplacement(&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
      }
      sVar5 = local_60;
      lVar3 = std::__cxx11::string::length();
      if (sVar5 == lVar3 - 1U) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_120,
                   "sub-command REGEX, mode REPLACE: replace-expression ends in a backslash.",
                   &local_121);
        cmCommand::SetError(&this->super_cmCommand,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
        this_local._7_1_ = false;
        local_128 = 1;
        goto LAB_005c9dc0;
      }
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__rhs_00);
      if ((*pcVar4 < '0') ||
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__rhs_00), '9' < *pcVar4)) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__rhs_00);
        if (*pcVar4 == 'n') {
          RegexReplacement::RegexReplacement(&local_178,"\n");
          std::
          vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
          ::push_back((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                       *)&l,&local_178);
          RegexReplacement::~RegexReplacement(&local_178);
        }
        else {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__rhs_00);
          if (*pcVar4 != '\\') {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)local_1c0,"sub-command REGEX, mode REPLACE: Unknown escape \"",
                       &local_1c1);
            std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
            std::__cxx11::string::substr((ulong)&re.searchstring,(ulong)__rhs_00);
            std::__cxx11::string::operator+=((string *)local_1c0,(string *)&re.searchstring);
            std::__cxx11::string::~string((string *)&re.searchstring);
            std::__cxx11::string::operator+=((string *)local_1c0,"\" in replace-expression.");
            cmCommand::SetError(&this->super_cmCommand,(string *)local_1c0);
            this_local._7_1_ = false;
            local_128 = 1;
            std::__cxx11::string::~string((string *)local_1c0);
            goto LAB_005c9dc0;
          }
          RegexReplacement::RegexReplacement((RegexReplacement *)((long)&e.field_2 + 8),"\\");
          std::
          vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
          ::push_back((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                       *)&l,(value_type *)((long)&e.field_2 + 8));
          RegexReplacement::~RegexReplacement((RegexReplacement *)((long)&e.field_2 + 8));
        }
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__rhs_00);
        RegexReplacement::RegexReplacement(&local_150,*pcVar4 + -0x30);
        std::
        vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
        ::push_back((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                     *)&l,&local_150);
        RegexReplacement::~RegexReplacement(&local_150);
      }
      local_60 = local_60 + 2;
    }
    r = local_60;
  }
  cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
  cmsys::RegularExpression::RegularExpression((RegularExpression *)((long)&e_1.field_2 + 8));
  pcVar4 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::RegularExpression::compile((RegularExpression *)((long)&e_1.field_2 + 8),pcVar4);
  if (bVar1) {
    local_328 = cmMakeRange<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          (args);
    r_00 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::advance(&local_328,5);
    std::__cxx11::string::string((string *)(output.field_2._M_local_buf + 8));
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((string *)local_318,r_00,(string *)(output.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&base);
    l2 = 0;
    while( true ) {
      lVar3 = std::__cxx11::string::c_str();
      bVar1 = cmsys::RegularExpression::find
                        ((RegularExpression *)((long)&e_1.field_2 + 8),(char *)(lVar3 + l2));
      if (!bVar1) break;
      cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
      cmMakefile::StoreMatches
                ((this->super_cmCommand).Makefile,(RegularExpression *)((long)&e_1.field_2 + 8));
      sVar5 = cmsys::RegularExpression::start((RegularExpression *)((long)&e_1.field_2 + 8));
      sVar6 = cmsys::RegularExpression::end((RegularExpression *)((long)&e_1.field_2 + 8));
      std::__cxx11::string::substr((ulong)((long)&e_2.field_2 + 8),(ulong)local_318);
      std::__cxx11::string::operator+=((string *)&base,(string *)(e_2.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(e_2.field_2._M_local_buf + 8));
      if (sVar6 == sVar5) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n,
                       "sub-command REGEX, mode REPLACE regex \"",__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n,
                       "\" matched an empty string.");
        std::__cxx11::string::~string((string *)&n);
        cmCommand::SetError(&this->super_cmCommand,(string *)local_3c0);
        this_local._7_1_ = false;
        local_128 = 1;
        std::__cxx11::string::~string((string *)local_3c0);
        goto LAB_005c9d70;
      }
      start._4_4_ = 0;
      while( true ) {
        sVar7 = std::
                vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                ::size((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                        *)&l);
        if (sVar7 <= start._4_4_) break;
        pvVar8 = std::
                 vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                 ::operator[]((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                               *)&l,(ulong)start._4_4_);
        if (pvVar8->number < 0) {
          pvVar8 = std::
                   vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                   ::operator[]((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                                 *)&l,(ulong)start._4_4_);
          std::__cxx11::string::operator+=((string *)&base,(string *)&pvVar8->value);
        }
        else {
          pvVar8 = std::
                   vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                   ::operator[]((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                                 *)&l,(ulong)start._4_4_);
          n_00 = pvVar8->number;
          sVar5 = cmsys::RegularExpression::start
                            ((RegularExpression *)((long)&e_1.field_2 + 8),n_00);
          sVar9 = cmsys::RegularExpression::end((RegularExpression *)((long)&e_1.field_2 + 8),n_00);
          lVar3 = std::__cxx11::string::length();
          if ((((sVar5 == 0xffffffffffffffff) || (sVar9 == 0xffffffffffffffff)) ||
              (lVar3 - l2 < sVar5)) || (lVar3 - l2 < sVar9)) {
            std::operator+(&local_4a0,"sub-command REGEX, mode REPLACE: replace expression \"",
                           __rhs_00);
            std::operator+(&local_480,&local_4a0,"\" contains an out-of-range escape for regex \"");
            std::operator+(&local_460,&local_480,__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_440,&local_460,"\".");
            std::__cxx11::string::~string((string *)&local_460);
            std::__cxx11::string::~string((string *)&local_480);
            std::__cxx11::string::~string((string *)&local_4a0);
            cmCommand::SetError(&this->super_cmCommand,(string *)local_440);
            this_local._7_1_ = false;
            local_128 = 1;
            std::__cxx11::string::~string((string *)local_440);
            goto LAB_005c9d70;
          }
          std::__cxx11::string::substr((ulong)((long)&e_3.field_2 + 8),(ulong)local_318);
          std::__cxx11::string::operator+=((string *)&base,(string *)(e_3.field_2._M_local_buf + 8))
          ;
          std::__cxx11::string::~string((string *)(e_3.field_2._M_local_buf + 8));
        }
        start._4_4_ = start._4_4_ + 1;
      }
      l2 = sVar6 + l2;
    }
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_4c0,(ulong)local_318);
    std::__cxx11::string::operator+=((string *)&base,local_4c0);
    std::__cxx11::string::~string(local_4c0);
    name = replacement.
           super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    this_00 = (this->super_cmCommand).Makefile;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(this_00,(string *)name,pcVar4);
    this_local._7_1_ = true;
    local_128 = 1;
LAB_005c9d70:
    std::__cxx11::string::~string((string *)&base);
    std::__cxx11::string::~string((string *)local_318);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&input.field_2 + 8),
                   "sub-command REGEX, mode REPLACE failed to compile regex \"",__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&input.field_2 + 8),"\".");
    std::__cxx11::string::~string((string *)(input.field_2._M_local_buf + 8));
    cmCommand::SetError(&this->super_cmCommand,(string *)local_2d8);
    this_local._7_1_ = false;
    local_128 = 1;
    std::__cxx11::string::~string((string *)local_2d8);
  }
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)((long)&e_1.field_2 + 8));
LAB_005c9dc0:
  std::vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ::~vector((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
             *)&l);
  return this_local._7_1_;
}

Assistant:

bool cmStringCommand::RegexReplace(std::vector<std::string> const& args)
{
  //"STRING(REGEX REPLACE <regular_expression> <replace_expression>
  // <output variable> <input> [<input>...])\n"
  std::string const& regex = args[2];
  std::string const& replace = args[3];
  std::string const& outvar = args[4];

  // Pull apart the replace expression to find the escaped [0-9] values.
  std::vector<RegexReplacement> replacement;
  std::string::size_type l = 0;
  while (l < replace.length()) {
    std::string::size_type r = replace.find('\\', l);
    if (r == std::string::npos) {
      r = replace.length();
      replacement.push_back(replace.substr(l, r - l));
    } else {
      if (r - l > 0) {
        replacement.push_back(replace.substr(l, r - l));
      }
      if (r == (replace.length() - 1)) {
        this->SetError("sub-command REGEX, mode REPLACE: "
                       "replace-expression ends in a backslash.");
        return false;
      }
      if ((replace[r + 1] >= '0') && (replace[r + 1] <= '9')) {
        replacement.push_back(replace[r + 1] - '0');
      } else if (replace[r + 1] == 'n') {
        replacement.push_back("\n");
      } else if (replace[r + 1] == '\\') {
        replacement.push_back("\\");
      } else {
        std::string e = "sub-command REGEX, mode REPLACE: Unknown escape \"";
        e += replace.substr(r, 2);
        e += "\" in replace-expression.";
        this->SetError(e);
        return false;
      }
      r += 2;
    }
    l = r;
  }

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if (!re.compile(regex.c_str())) {
    std::string e =
      "sub-command REGEX, mode REPLACE failed to compile regex \"" + regex +
      "\".";
    this->SetError(e);
    return false;
  }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmMakeRange(args).advance(5), std::string());

  // Scan through the input for all matches.
  std::string output;
  std::string::size_type base = 0;
  while (re.find(input.c_str() + base)) {
    this->Makefile->ClearMatches();
    this->Makefile->StoreMatches(re);
    std::string::size_type l2 = re.start();
    std::string::size_type r = re.end();

    // Concatenate the part of the input that was not matched.
    output += input.substr(base, l2);

    // Make sure the match had some text.
    if (r - l2 == 0) {
      std::string e = "sub-command REGEX, mode REPLACE regex \"" + regex +
        "\" matched an empty string.";
      this->SetError(e);
      return false;
    }

    // Concatenate the replacement for the match.
    for (unsigned int i = 0; i < replacement.size(); ++i) {
      if (replacement[i].number < 0) {
        // This is just a plain-text part of the replacement.
        output += replacement[i].value;
      } else {
        // Replace with part of the match.
        int n = replacement[i].number;
        std::string::size_type start = re.start(n);
        std::string::size_type end = re.end(n);
        std::string::size_type len = input.length() - base;
        if ((start != std::string::npos) && (end != std::string::npos) &&
            (start <= len) && (end <= len)) {
          output += input.substr(base + start, end - start);
        } else {
          std::string e =
            "sub-command REGEX, mode REPLACE: replace expression \"" +
            replace + "\" contains an out-of-range escape for regex \"" +
            regex + "\".";
          this->SetError(e);
          return false;
        }
      }
    }

    // Move past the match.
    base += r;
  }

  // Concatenate the text after the last match.
  output += input.substr(base, input.length() - base);

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}